

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O0

void __thiscall HashMap<String,_Variant>::~HashMap(HashMap<String,_Variant> *this)

{
  ItemBlock *pIVar1;
  ItemBlock *next;
  ItemBlock *i_1;
  Item *end;
  Item *i;
  HashMap<String,_Variant> *this_local;
  
  if (this->data != (Item **)0x0) {
    operator_delete__(this->data);
  }
  for (end = (this->_begin).item; end != &this->endItem; end = end->next) {
    Item::~Item(end);
  }
  pIVar1 = this->blocks;
  while (next = pIVar1, next != (ItemBlock *)0x0) {
    pIVar1 = next->next;
    if (next != (ItemBlock *)0x0) {
      operator_delete__(next);
    }
  }
  Item::~Item(&this->endItem);
  return;
}

Assistant:

~HashMap()
  {
    delete[] (char*)data;
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }